

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

Vec_Int_t * Abc_NtkCollectCiCones(Abc_Ntk_t *pNtk,int fVerbose)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  abctime aVar6;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Wec_t *p_02;
  void *pvVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *vArr1;
  Abc_Obj_t *pAVar9;
  abctime aVar10;
  abctime time;
  int iVar11;
  long lVar12;
  Vec_Int_t t;
  
  aVar6 = Abc_Clock();
  p = Abc_NtkDfs(pNtk,0);
  p_00 = Vec_IntAlloc(0);
  p_01 = Vec_IntAlloc(pNtk->vCis->nSize);
  p_02 = Vec_WecStart(pNtk->vObjs->nSize);
  iVar11 = p->nSize;
  while (0 < iVar11) {
    iVar11 = iVar11 + -1;
    pvVar7 = Vec_PtrEntry(p,iVar11);
    pVVar8 = Vec_WecEntry(p_02,*(int *)((long)pvVar7 + 0x10));
    Vec_IntPush(pVVar8,iVar11);
    for (lVar12 = 0; lVar12 < *(int *)((long)pvVar7 + 0x1c); lVar12 = lVar12 + 1) {
      vArr1 = Vec_WecEntry(p_02,*(int *)(*(long *)((long)pvVar7 + 0x20) + lVar12 * 4));
      Vec_IntTwoMerge2(vArr1,pVVar8,p_00);
      iVar4 = vArr1->nCap;
      iVar5 = vArr1->nSize;
      piVar1 = vArr1->pArray;
      iVar3 = p_00->nSize;
      piVar2 = p_00->pArray;
      vArr1->nCap = p_00->nCap;
      vArr1->nSize = iVar3;
      vArr1->pArray = piVar2;
      p_00->nCap = iVar4;
      p_00->nSize = iVar5;
      p_00->pArray = piVar1;
    }
  }
  for (iVar11 = 0; iVar11 < pNtk->vCis->nSize; iVar11 = iVar11 + 1) {
    pAVar9 = Abc_NtkCi(pNtk,iVar11);
    pVVar8 = Vec_WecEntry(p_02,pAVar9->Id);
    Vec_IntPush(p_01,pVVar8->nSize);
  }
  Vec_WecFree(p_02);
  Vec_PtrFree(p);
  Vec_IntFree(p_00);
  if (fVerbose != 0) {
    aVar10 = Abc_Clock();
    Abc_PrintTime(0x7a8ccb,(char *)(aVar10 - aVar6),time);
  }
  return p_01;
}

Assistant:

Vec_Int_t * Abc_NtkCollectCiCones( Abc_Ntk_t * pNtk, int fVerbose )
{
    abctime clk = Abc_Clock();
    Abc_Obj_t * pNode; int i, k;
    Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_Int_t * vFanin, * vFanout, * vTemp = Vec_IntAlloc( 0 );
    Vec_Int_t * vSuppsCi = Vec_IntAlloc( Abc_NtkCiNum(pNtk) );
    Vec_Wec_t * vSupps = Vec_WecStart( Abc_NtkObjNumMax(pNtk) );
    Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pNode, i )
    {
        vFanout = Vec_WecEntry(vSupps, Abc_ObjId(pNode));
        Vec_IntPush( vFanout, i );
        for ( k = 0; k < Abc_ObjFaninNum(pNode); k++ )
        {
            vFanin = Vec_WecEntry(vSupps, Abc_ObjFaninId(pNode, k));
            Vec_IntTwoMerge2( vFanin, vFanout, vTemp );
            ABC_SWAP( Vec_Int_t, *vFanin, *vTemp );
        }
    }
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntPush( vSuppsCi, Vec_IntSize(Vec_WecEntry(vSupps, Abc_ObjId(pNode))) );
    Vec_WecFree( vSupps );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTemp );
    if ( fVerbose )
        Abc_PrintTime( 1, "Output cone computation", Abc_Clock() - clk );
    //Vec_IntPrint( vSuppsCi );
    return vSuppsCi;
}